

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config_inl.hpp
# Opt level: O1

string * CLI::clean_name_string(string *name,string *keyChars)

{
  char *pcVar1;
  size_type sVar2;
  pointer pcVar3;
  long lVar4;
  size_type sVar5;
  string *__range2;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  lVar4 = ::std::__cxx11::string::find_first_of((char *)name,(ulong)(keyChars->_M_dataplus)._M_p,0);
  if ((lVar4 != -1) ||
     (((pcVar1 = (name->_M_dataplus)._M_p, *pcVar1 == '[' &&
       (pcVar1[name->_M_string_length - 1] == ']')) ||
      (lVar4 = ::std::__cxx11::string::find_first_of((char *)name,0x18453e,0), lVar4 != -1)))) {
    lVar4 = ::std::__cxx11::string::find((char)name,0x27);
    if ((lVar4 != -1) &&
       (lVar4 = ::std::__cxx11::string::find_first_of
                          ((char *)name,detail::escapedChars_abi_cxx11_,0), lVar4 != -1)) {
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      ::std::__cxx11::string::reserve((ulong)&local_50);
      sVar2 = name->_M_string_length;
      if (sVar2 != 0) {
        pcVar3 = (name->_M_dataplus)._M_p;
        sVar5 = 0;
        do {
          lVar4 = ::std::__cxx11::string::find(-0x28,(ulong)(uint)(int)pcVar3[sVar5]);
          if (lVar4 != -1) {
            ::std::__cxx11::string::push_back((char)&local_50);
          }
          ::std::__cxx11::string::push_back((char)&local_50);
          sVar5 = sVar5 + 1;
        } while (sVar2 != sVar5);
      }
      ::std::__cxx11::string::operator=((string *)name,(string *)&local_50);
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
    }
    ::std::__cxx11::string::insert((ulong)name,0,'\x01');
    ::std::__cxx11::string::push_back((char)name);
  }
  return name;
}

Assistant:

CLI11_INLINE std::string &clean_name_string(std::string &name, const std::string &keyChars) {
    if(name.find_first_of(keyChars) != std::string::npos || (name.front() == '[' && name.back() == ']') ||
       (name.find_first_of("'`\"\\") != std::string::npos)) {
        if(name.find_first_of('\'') == std::string::npos) {
            name.insert(0, 1, '\'');
            name.push_back('\'');
        } else {
            if(detail::has_escapable_character(name)) {
                name = detail::add_escaped_characters(name);
            }
            name.insert(0, 1, '\"');
            name.push_back('\"');
        }
    }
    return name;
}